

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

TypedExpectation<solitaire::colliders::interfaces::FoundationPileCollider_&(solitaire::piles::PileId)>
* __thiscall
testing::internal::
TypedExpectation<solitaire::colliders::interfaces::FoundationPileCollider_&(solitaire::piles::PileId)>
::WillOnce(TypedExpectation<solitaire::colliders::interfaces::FoundationPileCollider_&(solitaire::piles::PileId)>
           *this,Action<solitaire::colliders::interfaces::FoundationPileCollider_&(solitaire::piles::PileId)>
                 *action)

{
  Clause CVar1;
  uint uVar2;
  char *pcVar3;
  FailureReporterInterface *pFVar4;
  _Any_data *this_00;
  _Any_data *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  _Any_data local_38;
  
  CVar1 = (this->super_ExpectationBase).last_clause_;
  local_48 = &local_38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,
             ".WillOnce() cannot appear after .WillRepeatedly() or .RetiresOnSaturation().","");
  if (5 < (int)CVar1) {
    uVar2 = (this->super_ExpectationBase).line_;
    pcVar3 = (this->super_ExpectationBase).file_;
    pFVar4 = GetFailureReporter();
    (*pFVar4->_vptr_FailureReporterInterface[2])(pFVar4,0,pcVar3,(ulong)uVar2,&local_48);
  }
  if (local_48 != &local_38) {
    operator_delete(local_48,local_38._M_unused._M_member_pointer + 1);
  }
  (this->super_ExpectationBase).last_clause_ = kWillOnce;
  this_00 = (_Any_data *)operator_new(0x20);
  std::
  function<solitaire::colliders::interfaces::FoundationPileCollider_&(solitaire::piles::PileId)>::
  function((function<solitaire::colliders::interfaces::FoundationPileCollider_&(solitaire::piles::PileId)>
            *)this_00,&action->fun_);
  local_48 = this_00;
  std::vector<void_const*,std::allocator<void_const*>>::emplace_back<void_const*>
            ((vector<void_const*,std::allocator<void_const*>> *)
             &(this->super_ExpectationBase).untyped_actions_,&local_48);
  if ((this->super_ExpectationBase).cardinality_specified_ == false) {
    Exactly((testing *)&local_48,
            (int)((ulong)((long)(this->super_ExpectationBase).untyped_actions_.
                                super__Vector_base<const_void_*,_std::allocator<const_void_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->super_ExpectationBase).untyped_actions_.
                               super__Vector_base<const_void_*,_std::allocator<const_void_*>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 3));
    (this->super_ExpectationBase).cardinality_.impl_.
    super___shared_ptr<const_testing::CardinalityInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_48;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->super_ExpectationBase).cardinality_.impl_.
                super___shared_ptr<const_testing::CardinalityInterface,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,&local_40);
    if (local_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40._M_pi);
    }
  }
  return this;
}

Assistant:

TypedExpectation& WillOnce(const Action<F>& action) {
    ExpectSpecProperty(last_clause_ <= kWillOnce,
                       ".WillOnce() cannot appear after "
                       ".WillRepeatedly() or .RetiresOnSaturation().");
    last_clause_ = kWillOnce;

    untyped_actions_.push_back(new Action<F>(action));
    if (!cardinality_specified()) {
      set_cardinality(Exactly(static_cast<int>(untyped_actions_.size())));
    }
    return *this;
  }